

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_CheckPosition(AActor *thing,DVector2 *pos,FCheckPosition *tm,bool actorsonly)

{
  double dVar1;
  F3DFloor *pFVar2;
  bool bVar3;
  FTextureID FVar4;
  uint uVar5;
  int iVar6;
  sector_t *this;
  F3DFloor **ppFVar7;
  FBoundingBox *pFVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_3e0;
  CheckResult local_3d8;
  FLinePortal *local_3b0;
  FLinePortal *port;
  bool thisresult;
  double dStack_3a0;
  bool good;
  double thingdropoffz;
  CheckResult lcres;
  FMultiBlockLinesIterator it;
  undefined1 local_2d0 [4];
  TFlags<ActorFlag,_unsigned_int> local_2cc;
  TFlags<ActorFlag,_unsigned_int> local_2c8;
  undefined4 local_2c4;
  AActor *local_2c0;
  AActor *BlockingMobj;
  CheckResult tcres;
  undefined1 local_280 [8];
  FMultiBlockThingsIterator it2;
  FPortalGroupArray pcheck;
  FBoundingBox box;
  double delta2;
  double delta1;
  double ff_top;
  double ff_bottom;
  uint i;
  double thingtop;
  F3DFloor *rover;
  double realHeight;
  AActor *thingblocker;
  sector_t *newsec;
  bool actorsonly_local;
  FCheckPosition *tm_local;
  DVector2 *pos_local;
  AActor *thing_local;
  
  dVar1 = thing->Height;
  tm->thing = thing;
  (tm->pos).X = pos->X;
  (tm->pos).Y = pos->Y;
  dVar9 = AActor::Z(thing);
  (tm->pos).Z = dVar9;
  this = P_PointInSector(pos);
  tm->sector = this;
  thing->BlockingLine = (line_t *)0x0;
  tm->ceilingline = (line_t *)0x0;
  bVar3 = AActor::IsNoClip2(thing);
  if (bVar3) {
    dVar9 = sector_t::LowestFloorAt(this,pos,&tm->floorsector);
    tm->dropoffz = dVar9;
    tm->floorz = dVar9;
    dVar9 = sector_t::HighestCeilingAt(this,pos,&tm->ceilingsector);
    tm->ceilingz = dVar9;
    FVar4 = sector_t::GetTexture(tm->floorsector,0);
    (tm->floorpic).texnum = FVar4.texnum;
    iVar6 = sector_t::GetTerrain(tm->floorsector,0);
    tm->floorterrain = iVar6;
    FVar4 = sector_t::GetTexture(tm->ceilingsector,1);
    (tm->ceilingpic).texnum = FVar4.texnum;
  }
  else {
    bVar3 = sector_t::PortalBlocksMovement(this,1);
    if ((bVar3) && (bVar3 = sector_t::PortalBlocksMovement(this,0), bVar3)) {
      dVar9 = secplane_t::ZatPoint(&this->floorplane,pos);
      tm->dropoffz = dVar9;
      tm->floorz = dVar9;
      FVar4 = sector_t::GetTexture(this,0);
      (tm->floorpic).texnum = FVar4.texnum;
      dVar9 = secplane_t::ZatPoint(&this->ceilingplane,pos);
      tm->ceilingz = dVar9;
      FVar4 = sector_t::GetTexture(this,1);
      (tm->ceilingpic).texnum = FVar4.texnum;
      tm->ceilingsector = this;
      tm->floorsector = this;
      iVar6 = sector_t::GetTerrain(this,0);
      tm->floorterrain = iVar6;
    }
    else {
      P_GetFloorCeilingZ(tm,2);
    }
    if (thing->Height <= 0.0) {
      local_3e0 = AActor::Z(thing);
      local_3e0 = local_3e0 + 1.0;
    }
    else {
      local_3e0 = AActor::Top(thing);
    }
    for (ff_bottom._4_4_ = 0;
        uVar5 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&this->e->XFloor),
        ff_bottom._4_4_ < uVar5; ff_bottom._4_4_ = ff_bottom._4_4_ + 1) {
      ppFVar7 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&this->e->XFloor,(ulong)ff_bottom._4_4_
                          );
      pFVar2 = *ppFVar7;
      if (((pFVar2->flags & 2) != 0) && ((pFVar2->flags & 1) != 0)) {
        dVar9 = secplane_t::ZatPoint((pFVar2->bottom).plane,pos);
        dVar10 = secplane_t::ZatPoint((pFVar2->top).plane,pos);
        dVar11 = AActor::Z(thing);
        dVar11 = dVar11 - (dVar9 + (dVar10 - dVar9) / 2.0);
        dVar12 = local_3e0 - (dVar9 + (dVar10 - dVar9) / 2.0);
        if ((tm->floorz <= dVar10 && dVar10 != tm->floorz) && (ABS(dVar11) < ABS(dVar12))) {
          tm->dropoffz = dVar10;
          tm->floorz = dVar10;
          (tm->floorpic).texnum = ((pFVar2->top).texture)->texnum;
          iVar6 = sector_t::GetTerrain(pFVar2->model,(pFVar2->top).isceiling);
          tm->floorterrain = iVar6;
        }
        if ((dVar9 < tm->ceilingz) && (ABS(dVar12) <= ABS(dVar11))) {
          tm->ceilingz = dVar9;
          (tm->ceilingpic).texnum = ((pFVar2->bottom).texture)->texnum;
        }
      }
    }
  }
  tm->touchmidtex = false;
  tm->abovemidtex = false;
  validcount = validcount + 1;
  iVar6 = (int)thing;
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)((long)box.m_Box + 0x1c),
             iVar6 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)box.m_Box + 0x1c));
  bVar3 = false;
  if (uVar5 != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)(box.m_Box + 3),
               iVar6 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)(box.m_Box + 3));
    bVar3 = uVar5 == 0;
  }
  if (bVar3) {
    return true;
  }
  thing->BlockingMobj = (AActor *)0x0;
  realHeight = 0.0;
  if (thing->player != (player_t *)0x0) {
    thing->Height = dVar1 + thing->MaxStepHeight;
  }
  tm->stepthing = (AActor *)0x0;
  FBoundingBox::FBoundingBox((FBoundingBox *)&pcheck.data.Most,pos->X,pos->Y,thing->radius);
  FPortalGroupArray::FPortalGroupArray((FPortalGroupArray *)(it2.bbox.m_Box + 3),1);
  dVar9 = pos->X;
  dVar10 = pos->Y;
  dVar11 = AActor::Z(thing);
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            ((FMultiBlockThingsIterator *)local_280,(FPortalGroupArray *)(it2.bbox.m_Box + 3),dVar9,
             dVar10,dVar11,thing->Height,thing->radius,false,this);
  FMultiBlockThingsIterator::CheckResult::CheckResult((CheckResult *)&BlockingMobj);
LAB_0066f575:
  do {
    do {
      bVar3 = FMultiBlockThingsIterator::Next
                        ((FMultiBlockThingsIterator *)local_280,(CheckResult *)&BlockingMobj);
      if (!bVar3) {
        validcount = validcount + 1;
        thing->BlockingMobj = (AActor *)0x0;
        thing->Height = dVar1;
        bVar3 = true;
        if (!actorsonly) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    ((TFlags<ActorFlag,_unsigned_int> *)((long)it.bbox.m_Box + 0x1c),
                     iVar6 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)it.bbox.m_Box + 0x1c));
          bVar3 = uVar5 != 0;
        }
        if (bVar3) {
          thing->BlockingMobj = (AActor *)realHeight;
          thing_local._7_1_ = realHeight == 0.0;
        }
        else {
          TArray<spechit_t,_spechit_t>::Clear(&spechit);
          TArray<spechit_t,_spechit_t>::Clear(&portalhit);
          dVar1 = pos->X;
          dVar9 = pos->Y;
          dVar10 = AActor::Z(thing);
          FMultiBlockLinesIterator::FMultiBlockLinesIterator
                    ((FMultiBlockLinesIterator *)&lcres.portalflags,
                     (FPortalGroupArray *)(it2.bbox.m_Box + 3),dVar1,dVar9,dVar10,thing->Height,
                     thing->radius,this);
          FMultiBlockLinesIterator::CheckResult::CheckResult((CheckResult *)&thingdropoffz);
          dStack_3a0 = tm->floorz;
          tm->floorz = tm->dropoffz;
          port._7_1_ = 1;
          while (bVar3 = FMultiBlockLinesIterator::Next
                                   ((FMultiBlockLinesIterator *)&lcres.portalflags,
                                    (CheckResult *)&thingdropoffz), bVar3) {
            pFVar8 = FMultiBlockLinesIterator::Box((FMultiBlockLinesIterator *)&lcres.portalflags);
            port._6_1_ = PIT_CheckLine((FMultiBlockLinesIterator *)&lcres.portalflags,
                                       (CheckResult *)&thingdropoffz,pFVar8,tm);
            port._7_1_ = (port._7_1_ & 1 & port._6_1_) != 0;
            if (((((bool)port._6_1_) &&
                 (local_3b0 = line_t::getPortal((line_t *)thingdropoffz),
                 local_3b0 != (FLinePortal *)0x0)) && ((local_3b0->mFlags & 2) != 0)) &&
               (local_3b0->mType != '\x03')) {
              FMultiBlockLinesIterator::CheckResult::CheckResult
                        (&local_3d8,(CheckResult *)&thingdropoffz);
              pFVar8 = FMultiBlockLinesIterator::Box((FMultiBlockLinesIterator *)&lcres.portalflags)
              ;
              bVar3 = PIT_CheckPortal((FMultiBlockLinesIterator *)&lcres.portalflags,&local_3d8,
                                      pFVar8,tm);
              if (bVar3) {
                tm->thing->BlockingLine = (line_t *)thingdropoffz;
              }
            }
          }
          if ((port._7_1_ & 1) == 0) {
            thing_local._7_1_ = false;
          }
          else if (thing->Height <= tm->ceilingz - tm->floorz) {
            if ((tm->touchmidtex & 1U) == 0) {
              if (tm->stepthing != (AActor *)0x0) {
                tm->dropoffz = dStack_3a0;
              }
            }
            else {
              tm->dropoffz = tm->floorz;
            }
            thing->BlockingMobj = (AActor *)realHeight;
            thing_local._7_1_ = realHeight == 0.0;
          }
          else {
            thing_local._7_1_ = false;
          }
        }
LAB_0066fc6a:
        local_2c4 = 1;
        FMultiBlockThingsIterator::~FMultiBlockThingsIterator
                  ((FMultiBlockThingsIterator *)local_280);
        FPortalGroupArray::~FPortalGroupArray((FPortalGroupArray *)(it2.bbox.m_Box + 3));
        return thing_local._7_1_;
      }
      pFVar8 = FMultiBlockThingsIterator::Box((FMultiBlockThingsIterator *)local_280);
      bVar3 = PIT_CheckThing((FMultiBlockThingsIterator *)local_280,(CheckResult *)&BlockingMobj,
                             pFVar8,tm);
    } while (bVar3);
    local_2c0 = thing->BlockingMobj;
    if (((local_2c0 == (AActor *)0x0) || ((i_compatflags & 0x10U) != 0)) ||
       ((tcres.Position.Z._0_4_ & 0x80) != 0)) {
      thing->Height = dVar1;
      thing_local._7_1_ = false;
      goto LAB_0066fc6a;
    }
    bVar3 = false;
    if (local_2c0->player == (player_t *)0x0) {
      operator|((EnumType)local_2d0,MF_FLOAT);
      TFlags<ActorFlag,_unsigned_int>::operator|(&local_2cc,(ActorFlag)local_2d0);
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_2c8,&thing->flags);
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c8);
      bVar3 = false;
      if (uVar5 == 0) {
        dVar9 = AActor::Top(local_2c0);
        dVar10 = AActor::Z(thing);
        bVar3 = dVar9 - dVar10 <= thing->MaxStepHeight;
      }
    }
    if (!bVar3) {
      if (thing->player != (player_t *)0x0) {
        dVar9 = AActor::Top(thing);
        dVar10 = AActor::Z(local_2c0);
        if (dVar9 - dVar10 <= thing->MaxStepHeight) {
          if (realHeight != 0.0) {
            thing->Height = dVar1;
            thing_local._7_1_ = false;
            goto LAB_0066fc6a;
          }
          thing->BlockingMobj = (AActor *)0x0;
          goto LAB_0066f575;
        }
      }
      thing->Height = dVar1;
      thing_local._7_1_ = false;
      goto LAB_0066fc6a;
    }
    if (realHeight == 0.0) {
LAB_0066f7d0:
      realHeight = (double)local_2c0;
    }
    else {
      dVar9 = AActor::Z(local_2c0);
      dVar10 = AActor::Z((AActor *)realHeight);
      if (dVar10 < dVar9) goto LAB_0066f7d0;
    }
    thing->BlockingMobj = (AActor *)0x0;
  } while( true );
}

Assistant:

bool P_CheckPosition(AActor *thing, const DVector2 &pos, FCheckPosition &tm, bool actorsonly)
{
	sector_t *newsec;
	AActor *thingblocker;
	double realHeight = thing->Height;

	tm.thing = thing;

	tm.pos.X = pos.X;
	tm.pos.Y = pos.Y;
	tm.pos.Z = thing->Z();

	newsec = tm.sector = P_PointInSector(pos);
	tm.ceilingline = thing->BlockingLine = NULL;

	// Retrieve the base floor / ceiling from the target location.
	// Any contacted lines the step closer together will adjust them.
	if (!thing->IsNoClip2())
	{
		if (!newsec->PortalBlocksMovement(sector_t::ceiling) || !newsec->PortalBlocksMovement(sector_t::floor))
		{
			// Use P_GetFloorCeilingZ only if there's portals to consider. Its logic is subtly different than what is needed here for 3D floors.
			P_GetFloorCeilingZ(tm, FFCF_SAMESECTOR);
		}
		else
		{
			tm.floorz = tm.dropoffz = newsec->floorplane.ZatPoint(pos);
			tm.floorpic = newsec->GetTexture(sector_t::floor);
			tm.ceilingz = newsec->ceilingplane.ZatPoint(pos);
			tm.ceilingpic = newsec->GetTexture(sector_t::ceiling);
			tm.floorsector = tm.ceilingsector = newsec;
			tm.floorterrain = newsec->GetTerrain(sector_t::floor);
		}

		F3DFloor*  rover;
		double thingtop = thing->Height > 0 ? thing->Top() : thing->Z() + 1;

		for (unsigned i = 0; i<newsec->e->XFloor.ffloors.Size(); i++)
		{
			rover = newsec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(pos);
			double ff_top = rover->top.plane->ZatPoint(pos);

			double delta1 = thing->Z() - (ff_bottom + ((ff_top - ff_bottom) / 2));
			double delta2 = thingtop - (ff_bottom + ((ff_top - ff_bottom) / 2));

			if (ff_top > tm.floorz && fabs(delta1) < fabs(delta2))
			{
				tm.floorz = tm.dropoffz = ff_top;
				tm.floorpic = *rover->top.texture;
				tm.floorterrain = rover->model->GetTerrain(rover->top.isceiling);
			}
			if (ff_bottom < tm.ceilingz && fabs(delta1) >= fabs(delta2))
			{
				tm.ceilingz = ff_bottom;
				tm.ceilingpic = *rover->bottom.texture;
			}
		}
	}
	else
	{
		// With noclip2, we must ignore 3D floors and go right to the uppermost ceiling and lowermost floor.
		tm.floorz = tm.dropoffz = newsec->LowestFloorAt(pos, &tm.floorsector);
		tm.ceilingz = newsec->HighestCeilingAt(pos, &tm.ceilingsector);
		tm.floorpic = tm.floorsector->GetTexture(sector_t::floor);
		tm.floorterrain = tm.floorsector->GetTerrain(sector_t::floor);
		tm.ceilingpic = tm.ceilingsector->GetTexture(sector_t::ceiling);
	}

	tm.touchmidtex = false;
	tm.abovemidtex = false;
	validcount++;

	if ((thing->flags & MF_NOCLIP) && !(thing->flags & MF_SKULLFLY))
		return true;

	// Check things first, possibly picking things up.
	thing->BlockingMobj = NULL;
	thingblocker = NULL;
	if (thing->player)
	{ // [RH] Fake taller height to catch stepping up into things.
		thing->Height = realHeight + thing->MaxStepHeight;
	}

	tm.stepthing = NULL;
	FBoundingBox box(pos.X, pos.Y, thing->radius);

	FPortalGroupArray pcheck;
	FMultiBlockThingsIterator it2(pcheck, pos.X, pos.Y, thing->Z(), thing->Height, thing->radius, false, newsec);
	FMultiBlockThingsIterator::CheckResult tcres;

	while ((it2.Next(&tcres)))
	{
		if (!PIT_CheckThing(it2, tcres, it2.Box(), tm))
		{ // [RH] If a thing can be stepped up on, we need to continue checking
			// other things in the blocks and see if we hit something that is
			// definitely blocking. Otherwise, we need to check the lines, or we
			// could end up stuck inside a wall.
			AActor *BlockingMobj = thing->BlockingMobj;

			// If this blocks through a restricted line portal, it will always completely block.
			if (BlockingMobj == NULL || (i_compatflags & COMPATF_NO_PASSMOBJ) || (tcres.portalflags & FFCF_RESTRICTEDPORTAL))
			{ // Thing slammed into something; don't let it move now.
				thing->Height = realHeight;
				return false;
			}
			else if (!BlockingMobj->player && !(thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY)) &&
				BlockingMobj->Top() - thing->Z() <= thing->MaxStepHeight)
			{
				if (thingblocker == NULL ||
					BlockingMobj->Z() > thingblocker->Z())
				{
					thingblocker = BlockingMobj;
				}
				thing->BlockingMobj = NULL;
			}
			else if (thing->player &&
				thing->Top() - BlockingMobj->Z() <= thing->MaxStepHeight)
			{
				if (thingblocker)
				{ // There is something to step up on. Return this thing as
					// the blocker so that we don't step up.
					thing->Height = realHeight;
					return false;
				}
				// Nothing is blocking us, but this actor potentially could
				// if there is something else to step on.
				thing->BlockingMobj = NULL;
			}
			else
			{ // Definitely blocking
				thing->Height = realHeight;
				return false;
			}
		}
	}

	// check lines

	// [RH] We need to increment validcount again, because a function above may
	// have already set some lines to equal the current validcount.
	//
	// Specifically, when DehackedPickup spawns a new item in its TryPickup()
	// function, that new actor will set the lines around it to match validcount
	// when it links itself into the world. If we just leave validcount alone,
	// that will give the player the freedom to walk through walls at will near
	// a pickup they cannot get, because their validcount will prevent them from
	// being considered for collision with the player.
	validcount++;

	thing->BlockingMobj = NULL;
	thing->Height = realHeight;
	if (actorsonly || (thing->flags & MF_NOCLIP))
		return (thing->BlockingMobj = thingblocker) == NULL;

	spechit.Clear();
	portalhit.Clear();

	FMultiBlockLinesIterator it(pcheck, pos.X, pos.Y, thing->Z(), thing->Height, thing->radius, newsec);
	FMultiBlockLinesIterator::CheckResult lcres;

	double thingdropoffz = tm.floorz;
	//bool onthing = (thingdropoffz != tmdropoffz);
	tm.floorz = tm.dropoffz;

	bool good = true;

	while (it.Next(&lcres))
	{
		bool thisresult = PIT_CheckLine(it, lcres, it.Box(), tm);
		good &= thisresult;
		if (thisresult)
		{
			FLinePortal *port = lcres.line->getPortal();
			if (port != NULL && port->mFlags & PORTF_PASSABLE && port->mType != PORTT_LINKED)
			{
				// Checking the other side of the portal completely is too costly,
				// but checking the portal's destination line is necessary to 
				// retrieve the proper sector heights on the other side.
				if (PIT_CheckPortal(it, lcres, it.Box(), tm))
				{
					tm.thing->BlockingLine = lcres.line;
				}
			}
		}
	}
	if (!good)
	{
		return false;
	}
	if (tm.ceilingz - tm.floorz < thing->Height)
	{
		return false;
	}
	if (tm.touchmidtex)
	{
		tm.dropoffz = tm.floorz;
	}
	else if (tm.stepthing != NULL)
	{
		tm.dropoffz = thingdropoffz;
	}

	return (thing->BlockingMobj = thingblocker) == NULL;
}